

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O0

enable_if_t<IsFabArray<MultiFab>::value>
amrex::
FillPatchTwoLevels<amrex::MultiFab,amrex::StateDataPhysBCFunct,amrex::Interpolater,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
          (Array<amrex::MultiFab_*,_3> *mf,IntVect *nghost,Real time,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *cmf,Vector<double,_std::allocator<double>_> *ct,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *fmf,Vector<double,_std::allocator<double>_> *ft,int scomp,int dcomp,int ncomp,
          Geometry *cgeom,Geometry *fgeom,Array<amrex::StateDataPhysBCFunct,_3> *cbc,
          Array<int,_3> *cbccomp,Array<amrex::StateDataPhysBCFunct,_3> *fbc,Array<int,_3> *fbccomp,
          IntVect *ratio,Interpolater *mapper,Array<Vector<BCRec>,_3> *bcs,Array<int,_3> *bcscomp,
          NullInterpHook<amrex::FArrayBox> *pre_interp,NullInterpHook<amrex::FArrayBox> *post_interp
          )

{
  IndexSpace *index_space;
  Vector<double,_std::allocator<double>_> *in_stack_00002258;
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  *in_stack_00002260;
  Vector<double,_std::allocator<double>_> *in_stack_00002268;
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  *in_stack_00002270;
  Real in_stack_00002278;
  IntVect *in_stack_00002280;
  Array<amrex::MultiFab_*,_3> *in_stack_00002288;
  int in_stack_00002670;
  int in_stack_00002678;
  int in_stack_00002680;
  Geometry *in_stack_00002688;
  Geometry *in_stack_00002690;
  Array<amrex::StateDataPhysBCFunct,_3> *in_stack_00002698;
  Array<int,_3> *in_stack_000026a0;
  Array<amrex::StateDataPhysBCFunct,_3> *in_stack_000026a8;
  Array<int,_3> *in_stack_000026b0;
  IntVect *in_stack_000026b8;
  Interpolater *in_stack_000026c0;
  Array<Vector<BCRec>,_3> *in_stack_000026c8;
  Array<int,_3> *in_stack_000026d0;
  NullInterpHook<amrex::FArrayBox> *in_stack_000026d8;
  NullInterpHook<amrex::FArrayBox> *in_stack_000026e0;
  IndexSpace *in_stack_000026e8;
  
  EB2::TopIndexSpaceIfPresent();
  (anonymous_namespace)::
  FillPatchTwoLevels_doit<amrex::MultiFab,amrex::StateDataPhysBCFunct,amrex::Interpolater,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
            (in_stack_00002288,in_stack_00002280,in_stack_00002278,in_stack_00002270,
             in_stack_00002268,in_stack_00002260,in_stack_00002258,in_stack_00002670,
             in_stack_00002678,in_stack_00002680,in_stack_00002688,in_stack_00002690,
             in_stack_00002698,in_stack_000026a0,in_stack_000026a8,in_stack_000026b0,
             in_stack_000026b8,in_stack_000026c0,in_stack_000026c8,in_stack_000026d0,
             in_stack_000026d8,in_stack_000026e0,in_stack_000026e8);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
FillPatchTwoLevels (Array<MF*, AMREX_SPACEDIM> const& mf, IntVect const& nghost, Real time,
                    const Vector<Array<MF*, AMREX_SPACEDIM> >& cmf, const Vector<Real>& ct,
                    const Vector<Array<MF*, AMREX_SPACEDIM> >& fmf, const Vector<Real>& ft,
                    int scomp, int dcomp, int ncomp,
                    const Geometry& cgeom, const Geometry& fgeom,
                    Array<BC, AMREX_SPACEDIM>& cbc, const Array<int, AMREX_SPACEDIM>& cbccomp,
                    Array<BC, AMREX_SPACEDIM>& fbc, const Array<int, AMREX_SPACEDIM>& fbccomp,
                    const IntVect& ratio,
                    Interp* mapper,
                    const Array<Vector<BCRec>, AMREX_SPACEDIM>& bcs, const Array<int, AMREX_SPACEDIM>& bcscomp,
                    const PreInterpHook& pre_interp,
                    const PostInterpHook& post_interp)
{
#ifdef AMREX_USE_EB
    EB2::IndexSpace const* index_space = EB2::TopIndexSpaceIfPresent();
#else
    EB2::IndexSpace const* index_space = nullptr;
#endif

    FillPatchTwoLevels_doit(mf,nghost,time,cmf,ct,fmf,ft,
                            scomp,dcomp,ncomp,cgeom,fgeom,
                            cbc,cbccomp,fbc,fbccomp,ratio,mapper,bcs,bcscomp,
                            pre_interp,post_interp,index_space);
}